

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dB-hash.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ostream *poVar5;
  ulint uVar6;
  void *this;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  long in_RSI;
  int in_EDI;
  undefined1 auVar10 [16];
  uint s_1;
  uint m_2;
  uint s;
  uint m_1;
  uint h;
  ulint total;
  time_point t2;
  uint i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> occ;
  DBhash dBhash;
  time_point t1;
  string pattern;
  uint m;
  string out;
  string in;
  int mode;
  int search;
  int build;
  DBhash *in_stack_fffffffffffff518;
  DBhash *in_stack_fffffffffffff520;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffff528;
  DBhash *in_stack_fffffffffffff530;
  string *in_stack_fffffffffffff538;
  DBhash *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff568;
  string *in_stack_fffffffffffff570;
  DBhash *in_stack_fffffffffffff578;
  undefined8 in_stack_fffffffffffff6c0;
  uint uVar11;
  duration<double,_std::ratio<1L,_1L>_> in_stack_fffffffffffff6c8;
  uint local_91c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_918;
  string local_900 [672];
  string local_660 [32];
  string local_640 [672];
  DBhash local_3a0;
  undefined8 local_120;
  allocator local_111;
  string local_110 [32];
  string local_f0 [36];
  uint local_cc;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  uVar11 = (uint)((ulong)in_stack_fffffffffffff6c0 >> 0x20);
  local_4 = 0;
  if (in_EDI != 4) {
    std::operator<<((ostream *)&std::cout,"*** dB-hash data structure ***\n");
    std::operator<<((ostream *)&std::cout,"Usage: dB-hash option file [pattern] [pattern_length]\n")
    ;
    std::operator<<((ostream *)&std::cout,"where: \n");
    std::operator<<((ostream *)&std::cout,"- option = build|search.\n");
    std::operator<<((ostream *)&std::cout,
                    "- file = path of the text file (if build mode) or dB-hash .dbh file (if search mode). \n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- pattern_length = In build mode, specify this parameter, which is the pattern length\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- pattern = must be specified in search mode. It is the pattern to be searched in the index.\n"
                   );
    exit(0);
  }
  local_14 = 0;
  local_18 = 1;
  pcVar1 = *(char **)(in_RSI + 8);
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,&local_41);
  iVar4 = std::__cxx11::string::compare((char *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (iVar4 == 0) {
    local_1c = local_14;
  }
  else {
    pcVar1 = *(char **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar1,&local_79);
    iVar4 = std::__cxx11::string::compare((char *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (iVar4 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Unrecognized option ");
      poVar5 = std::operator<<(poVar5,*(char **)(local_10 + 8));
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    local_1c = local_18;
  }
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::string(local_c8,local_a0);
  std::__cxx11::string::append((char *)local_c8);
  std::__cxx11::string::string(local_f0);
  if (local_1c == local_18) {
    pcVar1 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,pcVar1,&local_111);
    std::__cxx11::string::operator=(local_f0,local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    local_cc = std::__cxx11::string::length();
  }
  if (local_1c == local_14) {
    local_cc = atoi(*(char **)(local_10 + 0x18));
  }
  local_120 = std::chrono::_V2::system_clock::now();
  bwtil::DBhash::DBhash(in_stack_fffffffffffff530);
  if (local_1c == local_14) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Building dB-hash of file ");
    poVar5 = std::operator<<(poVar5,local_a0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_640,local_a0);
    buildFromFile((string *)in_stack_fffffffffffff6c8.__r,uVar11);
    bwtil::DBhash::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    bwtil::DBhash::~DBhash(in_stack_fffffffffffff520);
    std::__cxx11::string::~string(local_640);
    poVar5 = std::operator<<((ostream *)&std::cout,"\nStoring dB-hash in ");
    poVar5 = std::operator<<(poVar5,local_c8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_660,local_c8);
    bwtil::DBhash::saveToFile(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    std::__cxx11::string::~string(local_660);
    std::operator<<((ostream *)&std::cout,"Done.\n");
  }
  if (local_1c == local_18) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Loading dB-hash from file ");
    poVar5 = std::operator<<(poVar5,local_a0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_900,local_a0);
    bwtil::DBhash::loadFromFile(in_stack_fffffffffffff568);
    uVar11 = (uint)((ulong)in_stack_fffffffffffff568 >> 0x20);
    bwtil::DBhash::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    bwtil::DBhash::~DBhash(in_stack_fffffffffffff520);
    std::__cxx11::string::~string(local_900);
    poVar5 = std::operator<<((ostream *)&std::cout,"Done.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    uVar6 = bwtil::DBhash::patternLength(&local_3a0);
    if (uVar6 != local_cc) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Error: structure built with pattern length ");
      uVar6 = bwtil::DBhash::patternLength(&local_3a0);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
      poVar5 = std::operator<<(poVar5,", but now searching a pattern of length ");
      this = (void *)std::ostream::operator<<(poVar5,local_cc);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"\nSearching pattern ");
    poVar5 = std::operator<<(poVar5,local_f0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bwtil::DBhash::getOccurrencies(in_stack_fffffffffffff578,in_stack_fffffffffffff570,uVar11);
    poVar5 = std::operator<<((ostream *)&std::cout,"The pattern occurs ");
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_918);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
    std::operator<<(poVar5," times in the text at the following positions : \n");
    for (local_91c = 0;
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_918),
        local_91c < sVar7; local_91c = local_91c + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffff520,(size_type)in_stack_fffffffffffff518);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar8);
      std::operator<<(poVar5," ");
    }
    std::operator<<((ostream *)&std::cout,"\n\nDone.\n");
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff530);
  }
  bwtil::printRSSstat();
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            (in_stack_fffffffffffff528,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffff520);
  std::chrono::
  duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff518);
  auVar10._0_8_ =
       std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                 ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffff6c8);
  auVar10._8_8_ = 0;
  uVar9 = vcvttsd2usi_avx512f(auVar10);
  if (uVar9 < 0xe10) {
    if (uVar9 < 0x3c) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Total time: ");
      in_stack_fffffffffffff520 = (DBhash *)std::ostream::operator<<(poVar5,uVar9);
      poVar5 = std::operator<<((ostream *)in_stack_fffffffffffff520,"s");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Total time: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)(uVar9 / 0x3c));
      poVar5 = std::operator<<(poVar5,"m ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar9 + (int)(uVar9 / 0x3c) * -0x3c);
      poVar5 = std::operator<<(poVar5,"s");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9 % 0xe10;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9 % 0xe10;
    poVar5 = std::operator<<((ostream *)&std::cout,"Total time: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)(uVar9 / 0xe10));
    poVar5 = std::operator<<(poVar5,"h ");
    poVar5 = (ostream *)
             std::ostream::operator<<(poVar5,SUB164(auVar2 * ZEXT816(0x444444444444445),8));
    poVar5 = std::operator<<(poVar5,"m ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(int)(uVar9 % 0xe10) +
                               SUB164(auVar3 * ZEXT816(0x444444444444445),8) * -0x3c);
    poVar5 = std::operator<<(poVar5,"s");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  bwtil::DBhash::~DBhash(in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a0);
  return local_4;
}

Assistant:

int main(int argc,char** argv) {

	if(argc != 4){
		cout << "*** dB-hash data structure ***\n";
		cout << "Usage: dB-hash option file [pattern] [pattern_length]\n";
		cout << "where: \n";
		cout <<	"- option = build|search.\n";
		cout <<	"- file = path of the text file (if build mode) or dB-hash .dbh file (if search mode). \n";
		cout << "- pattern_length = In build mode, specify this parameter, which is the pattern length\n";
		cout << "- pattern = must be specified in search mode. It is the pattern to be searched in the index.\n";
		exit(0);
	}

    using std::chrono::high_resolution_clock;
    using std::chrono::duration_cast;
    using std::chrono::duration;

	int build=0,search=1;

	int mode;

	if(string(argv[1]).compare("build")==0)
		mode=build;
	else if(string(argv[1]).compare("search")==0)
		mode=search;
	else{
		cout << "Unrecognized option "<<argv[1]<<endl;
		exit(0);
	}

	string in = string(argv[2]);
	string out = string(in);
	out.append(".dbh");

	uint m;

	string pattern;

	if(mode==search){
		pattern = string(argv[3]);
		m = pattern.length();
	}

	if(mode==build)
		m = atoi(argv[3]);

    auto t1 = high_resolution_clock::now();

	DBhash dBhash;

	if(mode==build){


		cout << "Building dB-hash of file "<< in << endl;
		dBhash = buildFromFile(in,m);

		cout << "\nStoring dB-hash in "<< out<<endl;
		dBhash.saveToFile(out);

		cout << "Done.\n";

	}

	if(mode==search){

		cout << "Loading dB-hash from file "<< in <<endl;
		dBhash = DBhash::loadFromFile(in);
		cout << "Done." << endl;

		if(dBhash.patternLength()!=m){
			cout << "Error: structure built with pattern length " << dBhash.patternLength() << ", but now searching a pattern of length " << m << endl;
			exit(1);
		}

		cout << "\nSearching pattern "<< pattern <<endl;

		vector<ulint> occ = dBhash.getOccurrencies( pattern );

		cout << "The pattern occurs " << occ.size() << " times in the text at the following positions : \n";

		for(uint i=0;i<occ.size();i++)
			cout << occ.at(i) << " ";

		cout << "\n\nDone.\n";

	}

	printRSSstat();
	auto t2 = high_resolution_clock::now();
	ulint total = duration_cast<duration<double, std::ratio<1>>>(t2 - t1).count();

	if(total>=3600){

		uint h = total/3600;
		uint m = (total%3600)/60;
		uint s = (total%3600)%60;

		cout << "Total time: " << h << "h " << m << "m " << s << "s" << endl;

	}else if (total>=60){

		uint m = total/60;
		uint s = total%60;

		cout << "Total time: " << m << "m " << s << "s" << endl;

	}else{

		cout << "Total time: " << total << "s" << endl;

	}
}